

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int wstran_listener_bind(void *arg,nng_url *url)

{
  int local_28;
  int local_24;
  int port;
  int rv;
  ws_listener *l;
  nng_url *url_local;
  void *arg_local;
  
  _port = arg;
  l = (ws_listener *)url;
  url_local = (nng_url *)arg;
  local_24 = nng_stream_listener_listen(*(nng_stream_listener **)((long)arg + 0x210));
  if (local_24 == 0) {
    nng_stream_listener_get_int
              (*(nng_stream_listener **)((long)_port + 0x210),"tcp-bound-port",&local_28);
    *(int *)&(l->aios).ll_offset = local_28;
  }
  return local_24;
}

Assistant:

static int
wstran_listener_bind(void *arg, nng_url *url)
{
	ws_listener *l = arg;
	int          rv;

	if ((rv = nng_stream_listener_listen(l->listener)) == 0) {
		int port;
		nng_stream_listener_get_int(
		    l->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		url->u_port = (uint32_t) port;
	}
	return (rv);
}